

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O3

void llvm::yaml::MappingTraits<llvm::DWARFYAML::File>::mapping(IO *IO,File *File)

{
  EmptyContext local_1c;
  EmptyContext local_1b;
  EmptyContext local_1a;
  EmptyContext local_19 [5];
  EmptyContext Ctx_3;
  EmptyContext Ctx_2;
  EmptyContext Ctx_1;
  EmptyContext Ctx;
  
  yaml::IO::processKey<llvm::StringRef,llvm::yaml::EmptyContext>
            (IO,"Name",&File->Name,true,local_19);
  yaml::IO::processKey<unsigned_long,llvm::yaml::EmptyContext>
            (IO,"DirIdx",&File->DirIdx,true,&local_1a);
  yaml::IO::processKey<unsigned_long,llvm::yaml::EmptyContext>
            (IO,"ModTime",&File->ModTime,true,&local_1b);
  yaml::IO::processKey<unsigned_long,llvm::yaml::EmptyContext>
            (IO,"Length",&File->Length,true,&local_1c);
  return;
}

Assistant:

void MappingTraits<DWARFYAML::File>::mapping(IO &IO, DWARFYAML::File &File) {
  IO.mapRequired("Name", File.Name);
  IO.mapRequired("DirIdx", File.DirIdx);
  IO.mapRequired("ModTime", File.ModTime);
  IO.mapRequired("Length", File.Length);
}